

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase148::run(TestCase148 *this)

{
  EventLoop *this_00;
  void **this_01;
  CapTableBuilder *pCVar1;
  RequestHook *pRVar2;
  long *plVar3;
  CapTableReader *pCVar4;
  ClientHook *pCVar5;
  WirePointer *pWVar6;
  undefined8 uVar7;
  Disposer *pDVar8;
  int iVar9;
  char *__n;
  ulong __n_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  bool bVar11;
  Own<capnp::ClientHook> OVar12;
  int callerCallCount;
  WaitScope waitScope;
  Response<capnproto_test::capnp::test::TestTailCallee::TailResult> response;
  int calleeCallCount;
  Client callee;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall2;
  Client caller;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall1;
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> dependentCall0;
  RemotePromise<capnproto_test::capnp::test::TestTailCallee::TailResult> promise;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  request;
  EventLoop loop;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_300;
  long *local_2c8;
  int local_2bc;
  EventLoop *local_2b8;
  undefined4 local_2b0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_2a8;
  long *local_270;
  int local_264;
  undefined1 local_260 [16];
  CapTableReader *pCStack_250;
  pointer_____offset_0x10___ *local_248;
  Client local_240;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_230;
  undefined1 local_1f8 [8];
  Client local_1f0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_1e0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_1a8;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_170;
  int local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  WirePointer *local_128;
  undefined4 local_120;
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  local_118;
  undefined1 local_d8 [80];
  Maybe<capnp::MessageSize> local_88;
  Maybe<capnp::MessageSize> local_70;
  Maybe<capnp::MessageSize> local_58;
  Maybe<capnp::MessageSize> local_40;
  
  this_00 = (EventLoop *)(local_d8 + 0x18);
  kj::EventLoop::EventLoop(this_00);
  local_2b0 = 0xffffffff;
  local_2b8 = this_00;
  kj::EventLoop::enterScope(this_00);
  local_264 = 0;
  local_2bc = 0;
  kj::heap<capnp::_::TestTailCalleeImpl,int&>((kj *)&local_300,&local_264);
  local_2a8.super_Builder._builder.segment =
       (SegmentBuilder *)
       CONCAT44(local_300.super_Builder._builder.segment._4_4_,
                local_300.super_Builder._builder.segment._0_4_);
  local_2a8.super_Builder._builder.capTable = local_300.super_Builder._builder.capTable + 2;
  if (local_300.super_Builder._builder.capTable == (CapTableBuilder *)0x0) {
    local_2a8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  }
  local_300.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  OVar12 = Capability::Client::makeLocalClient
                     (&local_240,(Own<capnp::Capability::Server> *)&local_2a8);
  pCVar1 = local_2a8.super_Builder._builder.capTable;
  if (local_2a8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_2a8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_2a8.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_2a8.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]),OVar12.ptr);
  }
  pCVar1 = local_300.super_Builder._builder.capTable;
  local_248 = &capnproto_test::capnp::test::TestTailCallee::Client::typeinfo;
  if (local_300.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_300.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_300.super_Builder._builder.segment._4_4_,
                         local_300.super_Builder._builder.segment._0_4_))
              ((undefined8 *)
               CONCAT44(local_300.super_Builder._builder.segment._4_4_,
                        local_300.super_Builder._builder.segment._0_4_),
               (_func_int *)
               ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
               (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  kj::heap<capnp::_::TestTailCallerImpl,int&>((kj *)&local_300,&local_2bc);
  __n = (char *)local_300.super_Builder._builder.capTable;
  local_2a8.super_Builder._builder.segment =
       (SegmentBuilder *)
       CONCAT44(local_300.super_Builder._builder.segment._4_4_,
                local_300.super_Builder._builder.segment._0_4_);
  local_2a8.super_Builder._builder.capTable = local_300.super_Builder._builder.capTable + 2;
  if (local_300.super_Builder._builder.capTable == (CapTableBuilder *)0x0) {
    local_2a8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  }
  local_300.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
  OVar12 = Capability::Client::makeLocalClient
                     (&local_1f0,(Own<capnp::Capability::Server> *)&local_2a8);
  pCVar1 = local_2a8.super_Builder._builder.capTable;
  if (local_2a8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_2a8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_2a8.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_2a8.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]),OVar12.ptr);
  }
  pCVar1 = local_300.super_Builder._builder.capTable;
  local_1f8 = (undefined1  [8])&capnproto_test::capnp::test::TestTailCaller::Client::typeinfo;
  if (local_300.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_300.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_300.super_Builder._builder.segment._4_4_,
                         local_300.super_Builder._builder.segment._0_4_))
              ((undefined8 *)
               CONCAT44(local_300.super_Builder._builder.segment._4_4_,
                        local_300.super_Builder._builder.segment._0_4_),
               (_func_int *)
               ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
               (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::TestTailCaller::Client::fooRequest
            (&local_118,(Client *)local_1f8,&local_40);
  *(undefined4 *)local_118.super_Builder._builder.data = 0x1c8;
  local_2a8.super_Builder._builder.segment =
       (SegmentBuilder *)
       CONCAT44(local_118.super_Builder._builder.segment._4_4_,
                local_118.super_Builder._builder.segment._0_4_);
  local_2a8.super_Builder._builder.capTable =
       (CapTableBuilder *)
       CONCAT44(local_118.super_Builder._builder.capTable._4_4_,
                local_118.super_Builder._builder.capTable._0_4_);
  local_2a8.super_Builder._builder.data = local_118.super_Builder._builder.pointers;
  (**(code **)(**(long **)((long)&local_240.hook.disposer + (long)local_248[-3]) + 0x20))
            (&local_300);
  PointerBuilder::setCapability((PointerBuilder *)&local_2a8,(Own<capnp::ClientHook> *)&local_300);
  pCVar1 = local_300.super_Builder._builder.capTable;
  pvVar10 = extraout_RDX;
  if (local_300.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_300.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_300.super_Builder._builder.segment._4_4_,
                         local_300.super_Builder._builder.segment._0_4_))
              ((undefined8 *)
               CONCAT44(local_300.super_Builder._builder.segment._4_4_,
                        local_300.super_Builder._builder.segment._0_4_),
               (_func_int *)
               ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
               (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]));
    pvVar10 = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestTailCaller::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::send(&local_170,(int)&local_118,pvVar10,(size_t)__n,in_R8D);
  this_01 = &local_170.super_Builder._builder.data;
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)&local_300,(Pipeline *)this_01);
  local_58.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_2a8,(Client *)&local_300,&local_58);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_1a8,(int)&local_2a8,__buf,(size_t)__n,in_R8D);
  pRVar2 = local_2a8.hook.ptr;
  if (local_2a8.hook.ptr != (RequestHook *)0x0) {
    local_2a8.hook.ptr = (RequestHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_2a8.hook.disposer._4_4_,(uint)local_2a8.hook.disposer)
    )((undefined8 *)CONCAT44(local_2a8.hook.disposer._4_4_,(uint)local_2a8.hook.disposer),
      (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2]));
  }
  pvVar10 = local_300.super_Builder._builder.data;
  if ((long *)local_300.super_Builder._builder.data != (long *)0x0) {
    local_300.super_Builder._builder.data = (long *)0x0;
    (**((local_300.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_300.super_Builder._builder.capTable,(long)pvVar10 + *(long *)(*pvVar10 + -0x10)
              );
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestTailCallee::TailResult>_> *)
             &local_2a8,&local_170);
  if (local_2a8.super_Builder._builder.dataSize < 0x20) {
    if (2 < kj::_::Debug::minSeverity) goto LAB_0027c033;
    local_1e0.super_Builder._builder.segment._0_4_ = 0;
LAB_0027bf80:
    local_300.super_Builder._builder.segment._0_4_ = 0x1c8;
    __n = "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()";
    in_R8D = 0x4a97b0;
    kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xa7,ERROR,
               "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()",
               (char (*) [44])"failed: expected (456) == (response.getI())",(int *)&local_300,
               (uint *)&local_1e0);
    if (0x1f < local_2a8.super_Builder._builder.dataSize) goto LAB_0027bfd9;
    if (2 < kj::_::Debug::minSeverity) goto LAB_0027c033;
    local_1e0.super_Builder._builder.segment._0_4_ = 0;
  }
  else {
    if ((((WireValue<uint32_t>_conflict *)local_2a8.super_Builder._builder.data)->value != 0x1c8) &&
       (__n = (char *)&kj::_::Debug::minSeverity, kj::_::Debug::minSeverity < 3)) {
      local_1e0.super_Builder._builder.segment._0_4_ =
           ((WireValue<uint32_t>_conflict *)local_2a8.super_Builder._builder.data)->value;
      goto LAB_0027bf80;
    }
LAB_0027bfd9:
    if ((((WireValue<uint32_t>_conflict *)local_2a8.super_Builder._builder.data)->value == 0x1c8) ||
       (__n = (char *)&kj::_::Debug::minSeverity, 2 < kj::_::Debug::minSeverity)) goto LAB_0027c033;
    local_1e0.super_Builder._builder.segment._0_4_ =
         ((WireValue<uint32_t>_conflict *)local_2a8.super_Builder._builder.data)->value;
  }
  local_300.super_Builder._builder.segment._0_4_ = 0x1c8;
  __n = "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()";
  in_R8D = 0x4a97b0;
  kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
             ,0xa8,ERROR,
             "\"failed: expected \" \"(456) == (response.getI())\", 456, response.getI()",
             (char (*) [44])"failed: expected (456) == (response.getI())",(int *)&local_300,
             (uint *)&local_1e0);
LAB_0027c033:
  capnproto_test::capnp::test::TestTailCallee::TailResult::Pipeline::getC
            ((Client *)&local_230,(Pipeline *)this_01);
  local_70.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_300,(Client *)&local_230,&local_70);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_1e0,(int)&local_300,__buf_00,(size_t)__n,in_R8D);
  pRVar2 = local_300.hook.ptr;
  if (local_300.hook.ptr != (RequestHook *)0x0) {
    local_300.hook.ptr = (RequestHook *)0x0;
    (**(local_300.hook.disposer)->_vptr_Disposer)
              (local_300.hook.disposer,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pvVar10 = local_230.super_Builder._builder.data;
  if ((long *)local_230.super_Builder._builder.data != (long *)0x0) {
    local_230.super_Builder._builder.data = (long *)0x0;
    (**((local_230.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_230.super_Builder._builder.capTable,(long)pvVar10 + *(long *)(*pvVar10 + -0x10)
              );
  }
  local_128 = (WirePointer *)0x0;
  if (1 < local_2a8.super_Builder._builder.pointerCount) {
    local_128 = local_2a8.super_Builder._builder.pointers + 1;
  }
  __n_00 = 0x7fffffff;
  if (1 < local_2a8.super_Builder._builder.pointerCount) {
    __n_00 = (ulong)(uint)local_2a8.hook.disposer;
  }
  else {
    local_2a8.super_Builder._builder.segment._0_4_ = 0;
    local_2a8.super_Builder._builder.segment._4_4_ = 0;
    local_2a8.super_Builder._builder.capTable._0_4_ = 0;
    local_2a8.super_Builder._builder.capTable._4_4_ = 0;
  }
  local_120 = (undefined4)__n_00;
  local_138 = (int)local_2a8.super_Builder._builder.segment;
  uStack_134 = local_2a8.super_Builder._builder.segment._4_4_;
  uStack_130 = local_2a8.super_Builder._builder.capTable._0_4_;
  uStack_12c = local_2a8.super_Builder._builder.capTable._4_4_;
  PointerReader::getCapability((PointerReader *)local_d8);
  local_260._8_8_ = local_d8._0_8_;
  pCStack_250 = (CapTableReader *)local_d8._8_8_;
  local_260._0_8_ = &capnproto_test::capnp::test::TestCallOrder::Client::typeinfo;
  local_88.ptr.isSet = false;
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_300,(Client *)local_260,&local_88);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_230,(int)&local_300,__buf_01,__n_00,in_R8D);
  pRVar2 = local_300.hook.ptr;
  if (local_300.hook.ptr != (RequestHook *)0x0) {
    local_300.hook.ptr = (RequestHook *)0x0;
    (**(local_300.hook.disposer)->_vptr_Disposer)
              (local_300.hook.disposer,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pCVar4 = pCStack_250;
  if (pCStack_250 != (CapTableReader *)0x0) {
    pCStack_250 = (CapTableReader *)0x0;
    (*(code *)(*(Arena **)local_260._8_8_)->_vptr_Arena)
              (local_260._8_8_,
               (_func_int *)
               ((long)&pCVar4->_vptr_CapTableReader + (long)pCVar4->_vptr_CapTableReader[-2]));
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_300,&local_1a8);
  plVar3 = local_2c8;
  if (local_300.super_Builder._builder.dataSize < 0x20) {
    bVar11 = false;
  }
  else {
    bVar11 = *local_300.super_Builder._builder.data != 0;
  }
  if (local_2c8 != (long *)0x0) {
    local_2c8 = (long *)0x0;
    (**(local_300.hook.ptr)->_vptr_RequestHook)
              (local_300.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if ((bool)(bVar11 & kj::_::Debug::minSeverity < 3)) {
    local_138 = 0;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_300,&local_1a8);
    iVar9 = 0;
    if (0x1f < local_300.super_Builder._builder.dataSize) {
      iVar9 = *local_300.super_Builder._builder.data;
    }
    local_260._0_4_ = iVar9;
    kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xae,ERROR,
               "\"failed: expected \" \"(0) == (dependentCall0.wait(waitScope).getN())\", 0, dependentCall0.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (0) == (dependentCall0.wait(waitScope).getN())",
               &local_138,(uint *)local_260);
    plVar3 = local_2c8;
    if (local_2c8 != (long *)0x0) {
      local_2c8 = (long *)0x0;
      (**(local_300.hook.ptr)->_vptr_RequestHook)
                (local_300.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_300,&local_1e0);
  plVar3 = local_2c8;
  bVar11 = true;
  if (0x1f < local_300.super_Builder._builder.dataSize) {
    bVar11 = *local_300.super_Builder._builder.data != 1;
  }
  if (local_2c8 != (long *)0x0) {
    local_2c8 = (long *)0x0;
    (**(local_300.hook.ptr)->_vptr_RequestHook)
              (local_300.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if ((bool)(bVar11 & kj::_::Debug::minSeverity < 3)) {
    local_138 = 1;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_300,&local_1e0);
    iVar9 = 0;
    if (0x1f < local_300.super_Builder._builder.dataSize) {
      iVar9 = *local_300.super_Builder._builder.data;
    }
    local_260._0_4_ = iVar9;
    kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xaf,ERROR,
               "\"failed: expected \" \"(1) == (dependentCall1.wait(waitScope).getN())\", 1, dependentCall1.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (1) == (dependentCall1.wait(waitScope).getN())",
               &local_138,(uint *)local_260);
    plVar3 = local_2c8;
    if (local_2c8 != (long *)0x0) {
      local_2c8 = (long *)0x0;
      (**(local_300.hook.ptr)->_vptr_RequestHook)
                (local_300.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_300,&local_230);
  plVar3 = local_2c8;
  bVar11 = true;
  if (0x1f < local_300.super_Builder._builder.dataSize) {
    bVar11 = *local_300.super_Builder._builder.data != 2;
  }
  if (local_2c8 != (long *)0x0) {
    local_2c8 = (long *)0x0;
    (**(local_300.hook.ptr)->_vptr_RequestHook)
              (local_300.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  if ((bool)(bVar11 & kj::_::Debug::minSeverity < 3)) {
    local_138 = 2;
    kj::
    Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>::
    wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_300,&local_230);
    iVar9 = 0;
    if (0x1f < local_300.super_Builder._builder.dataSize) {
      iVar9 = *local_300.super_Builder._builder.data;
    }
    local_260._0_4_ = iVar9;
    kj::_::Debug::log<char_const(&)[64],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xb0,ERROR,
               "\"failed: expected \" \"(2) == (dependentCall2.wait(waitScope).getN())\", 2, dependentCall2.wait(waitScope).getN()"
               ,(char (*) [64])"failed: expected (2) == (dependentCall2.wait(waitScope).getN())",
               &local_138,(uint *)local_260);
    plVar3 = local_2c8;
    if (local_2c8 != (long *)0x0) {
      local_2c8 = (long *)0x0;
      (**(local_300.hook.ptr)->_vptr_RequestHook)
                (local_300.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  if (kj::_::Debug::minSeverity < 3 && local_264 != 1) {
    local_300.super_Builder._builder.segment._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[42],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xb2,ERROR,"\"failed: expected \" \"(1) == (calleeCallCount)\", 1, calleeCallCount",
               (char (*) [42])"failed: expected (1) == (calleeCallCount)",(int *)&local_300,
               &local_264);
  }
  if ((local_2bc != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_300.super_Builder._builder.segment._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[42],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0xb3,ERROR,"\"failed: expected \" \"(1) == (callerCallCount)\", 1, callerCallCount",
               (char (*) [42])"failed: expected (1) == (callerCallCount)",(int *)&local_300,
               &local_2bc);
  }
  pDVar8 = local_230.hook.disposer;
  uVar7 = local_230.super_Builder._builder._32_8_;
  if (local_230.super_Builder._builder._32_8_ != 0) {
    local_230.super_Builder._builder.dataSize = 0;
    local_230.super_Builder._builder.pointerCount = 0;
    local_230.super_Builder._builder._38_2_ = 0;
    local_230.hook.disposer = (Disposer *)0x0;
    (**(local_230.hook.ptr)->_vptr_RequestHook)(local_230.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_230.super_Builder._builder.pointers;
  if (local_230.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_230.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_230.super_Builder._builder.data)
              (local_230.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar1 = local_230.super_Builder._builder.capTable;
  if (local_230.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_230.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_230.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_230.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pDVar8 = local_1e0.hook.disposer;
  uVar7 = local_1e0.super_Builder._builder._32_8_;
  if (local_1e0.super_Builder._builder._32_8_ != 0) {
    local_1e0.super_Builder._builder.dataSize = 0;
    local_1e0.super_Builder._builder.pointerCount = 0;
    local_1e0.super_Builder._builder._38_2_ = 0;
    local_1e0.hook.disposer = (Disposer *)0x0;
    (**(local_1e0.hook.ptr)->_vptr_RequestHook)(local_1e0.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_1e0.super_Builder._builder.pointers;
  if (local_1e0.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_1e0.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_1e0.super_Builder._builder.data)
              (local_1e0.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar1 = local_1e0.super_Builder._builder.capTable;
  if (local_1e0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_1e0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_1e0.super_Builder._builder.segment._4_4_,
                         (uint)local_1e0.super_Builder._builder.segment))
              ((undefined8 *)
               CONCAT44(local_1e0.super_Builder._builder.segment._4_4_,
                        (uint)local_1e0.super_Builder._builder.segment),
               (_func_int *)
               ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
               (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  plVar3 = local_270;
  if (local_270 != (long *)0x0) {
    local_270 = (long *)0x0;
    (**(local_2a8.hook.ptr)->_vptr_RequestHook)
              (local_2a8.hook.ptr,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pDVar8 = local_1a8.hook.disposer;
  uVar7 = local_1a8.super_Builder._builder._32_8_;
  if (local_1a8.super_Builder._builder._32_8_ != 0) {
    local_1a8.super_Builder._builder.dataSize = 0;
    local_1a8.super_Builder._builder.pointerCount = 0;
    local_1a8.super_Builder._builder._38_2_ = 0;
    local_1a8.hook.disposer = (Disposer *)0x0;
    (**(local_1a8.hook.ptr)->_vptr_RequestHook)(local_1a8.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_1a8.super_Builder._builder.pointers;
  if (local_1a8.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_1a8.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_1a8.super_Builder._builder.data)
              (local_1a8.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar1 = local_1a8.super_Builder._builder.capTable;
  if (local_1a8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_1a8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1a8.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_1a8.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pDVar8 = local_170.hook.disposer;
  uVar7 = local_170.super_Builder._builder._32_8_;
  if (local_170.super_Builder._builder._32_8_ != 0) {
    local_170.super_Builder._builder.dataSize = 0;
    local_170.super_Builder._builder.pointerCount = 0;
    local_170.super_Builder._builder._38_2_ = 0;
    local_170.hook.disposer = (Disposer *)0x0;
    (**(local_170.hook.ptr)->_vptr_RequestHook)(local_170.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_170.super_Builder._builder.pointers;
  if (local_170.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_170.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_170.super_Builder._builder.data)
              (local_170.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 + -0x10));
  }
  pCVar1 = local_170.super_Builder._builder.capTable;
  if (local_170.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_170.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_170.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_170.super_Builder._builder.segment,
      (_func_int *)
      ((long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader +
      (long)(pCVar1->super_CapTableReader)._vptr_CapTableReader[-2]));
  }
  pRVar2 = local_118.hook.ptr;
  if (local_118.hook.ptr != (RequestHook *)0x0) {
    local_118.hook.ptr = (RequestHook *)0x0;
    (**(local_118.hook.disposer)->_vptr_Disposer)
              (local_118.hook.disposer,
               (_func_int *)((long)&pRVar2->_vptr_RequestHook + (long)pRVar2->_vptr_RequestHook[-2])
              );
  }
  pCVar5 = local_1f0.hook.ptr;
  if (local_1f0.hook.ptr != (ClientHook *)0x0) {
    local_1f0.hook.ptr = (ClientHook *)0x0;
    (**(local_1f0.hook.disposer)->_vptr_Disposer)
              (local_1f0.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  pCVar5 = local_240.hook.ptr;
  if (local_240.hook.ptr != (ClientHook *)0x0) {
    local_240.hook.ptr = (ClientHook *)0x0;
    (**(local_240.hook.disposer)->_vptr_Disposer)
              (local_240.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  kj::EventLoop::leaveScope(local_2b8);
  kj::EventLoop::~EventLoop((EventLoop *)(local_d8 + 0x18));
  return;
}

Assistant:

TEST(Capability, TailCall) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int calleeCallCount = 0;
  int callerCallCount = 0;

  test::TestTailCallee::Client callee(kj::heap<TestTailCalleeImpl>(calleeCallCount));
  test::TestTailCaller::Client caller(kj::heap<TestTailCallerImpl>(callerCallCount));

  auto request = caller.fooRequest();
  request.setI(456);
  request.setCallee(callee);

  auto promise = request.send();

  auto dependentCall0 = promise.getC().getCallSequenceRequest().send();

  auto response = promise.wait(waitScope);
  EXPECT_EQ(456, response.getI());
  EXPECT_EQ(456, response.getI());

  auto dependentCall1 = promise.getC().getCallSequenceRequest().send();

  auto dependentCall2 = response.getC().getCallSequenceRequest().send();

  EXPECT_EQ(0, dependentCall0.wait(waitScope).getN());
  EXPECT_EQ(1, dependentCall1.wait(waitScope).getN());
  EXPECT_EQ(2, dependentCall2.wait(waitScope).getN());

  EXPECT_EQ(1, calleeCallCount);
  EXPECT_EQ(1, callerCallCount);
}